

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O0

GLXContext __thiscall
tcu::x11::glx::GlxVisual::createContext
          (GlxVisual *this,GlxContextFactory *factory,ContextType *contextType,
          ResetNotificationStrategy resetNotificationStrategy)

{
  PFNGLXCREATECONTEXTATTRIBSARBPROC p_Var1;
  GLXFBConfig p_Var2;
  bool bVar3;
  Profile PVar4;
  ContextFlags CVar5;
  InternalError *pIVar6;
  Display *pDVar7;
  reference pvVar8;
  GLXContext value;
  __GLXcontextRec *p_Var9;
  value_type_conflict1 local_88 [4];
  ApiType local_78;
  value_type_conflict1 local_74;
  ApiType local_70;
  uint local_6c [2];
  int flags;
  value_type_conflict1 local_60;
  int local_5c;
  value_type_conflict1 local_58 [2];
  ApiType local_50;
  int profileMask;
  ApiType apiType;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> attribs;
  ResetNotificationStrategy resetNotificationStrategy_local;
  ContextType *contextType_local;
  GlxContextFactory *factory_local;
  GlxVisual *this_local;
  
  attribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = resetNotificationStrategy;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
  checkGlxVersion(this->m_display,1,4);
  checkGlxExtension(this->m_display,"GLX_ARB_create_context");
  checkGlxExtension(this->m_display,"GLX_ARB_create_context_profile");
  local_50 = glu::ContextType::getAPI(contextType);
  local_58[1] = 0;
  PVar4 = glu::ApiType::getProfile(&local_50);
  if (PVar4 == PROFILE_ES) {
    checkGlxExtension(this->m_display,"GLX_EXT_create_context_es2_profile");
    local_58[1] = 4;
  }
  else if (PVar4 == PROFILE_CORE) {
    local_58[1] = 1;
  }
  else if (PVar4 == PROFILE_COMPATIBILITY) {
    local_58[1] = 2;
  }
  local_58[0] = 0x2091;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_40,local_58);
  local_5c = glu::ApiType::getMajorVersion(&local_50);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_40,&local_5c);
  local_60 = 0x2092;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_40,&local_60);
  flags = glu::ApiType::getMinorVersion(&local_50);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_40,&flags);
  local_6c[1] = 0x9126;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_40,(value_type_conflict1 *)(local_6c + 1));
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_40,local_58 + 1);
  local_6c[0] = 0;
  CVar5 = glu::ContextType::getFlags(contextType);
  CVar5 = glu::operator&(CVar5,CONTEXT_FORWARD_COMPATIBLE);
  if (CVar5 != 0) {
    local_70.m_bits = (contextType->super_ApiType).m_bits;
    bVar3 = glu::isContextTypeES((ContextType)local_70.m_bits);
    if (bVar3) {
      pIVar6 = (InternalError *)__cxa_allocate_exception(0x38);
      InternalError::InternalError
                (pIVar6,"Only OpenGL core contexts can be forward-compatible",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
                 ,0x158);
      __cxa_throw(pIVar6,&InternalError::typeinfo,InternalError::~InternalError);
    }
    local_6c[0] = local_6c[0] | 2;
  }
  CVar5 = glu::ContextType::getFlags(contextType);
  CVar5 = glu::operator&(CVar5,CONTEXT_DEBUG);
  if (CVar5 != 0) {
    local_6c[0] = local_6c[0] | 1;
  }
  CVar5 = glu::ContextType::getFlags(contextType);
  CVar5 = glu::operator&(CVar5,CONTEXT_ROBUST);
  if (CVar5 != 0) {
    local_6c[0] = local_6c[0] | 4;
  }
  if (local_6c[0] != 0) {
    local_74 = 0x2094;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_40,&local_74);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_40,(value_type_conflict1 *)local_6c);
  }
  if (attribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ != RESET_NOTIFICATION_STRATEGY_NOT_SPECIFIED) {
    local_78.m_bits = (contextType->super_ApiType).m_bits;
    bVar3 = glu::isContextTypeES((ContextType)local_78.m_bits);
    if (bVar3) {
      pIVar6 = (InternalError *)__cxa_allocate_exception(0x38);
      InternalError::InternalError
                (pIVar6,
                 "Specifying reset notification strategy is not allowed when creating OpenGL ES contexts"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
                 ,0x16d);
      __cxa_throw(pIVar6,&InternalError::typeinfo,InternalError::~InternalError);
    }
    local_88[3] = 0x8256;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_40,local_88 + 3);
    if (attribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ == RESET_NOTIFICATION_STRATEGY_NO_RESET_NOTIFICATION) {
      local_88[2] = 0x8261;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_40,local_88 + 2);
    }
    else {
      if (attribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ != RESET_NOTIFICATION_STRATEGY_LOSE_CONTEXT_ON_RESET) {
        pIVar6 = (InternalError *)__cxa_allocate_exception(0x38);
        InternalError::InternalError
                  (pIVar6,"Unknown reset notification strategy",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
                   ,0x176);
        __cxa_throw(pIVar6,&InternalError::typeinfo,InternalError::~InternalError);
      }
      local_88[1] = 0x8252;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_40,local_88 + 1);
    }
  }
  local_88[0] = 0;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_40,local_88);
  p_Var1 = factory->m_glXCreateContextAttribsARB;
  pDVar7 = getXDisplay(this);
  p_Var2 = this->m_fbConfig;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,0);
  value = (*p_Var1)(pDVar7,p_Var2,(GLXContext)0x0,1,pvVar8);
  p_Var9 = checkGLX<__GLXcontextRec*>
                     (value,
                      "factory.m_glXCreateContextAttribsARB( getXDisplay(), m_fbConfig, DE_NULL, True, &attribs[0])"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
                      ,0x17d);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  return p_Var9;
}

Assistant:

GLXContext GlxVisual::createContext (const GlxContextFactory&		factory,
									 const ContextType&				contextType,
									 glu::ResetNotificationStrategy	resetNotificationStrategy)
{
	std::vector<int>	attribs;

	checkGlxVersion(m_display, 1, 4);
	checkGlxExtension(m_display, "GLX_ARB_create_context");
	checkGlxExtension(m_display, "GLX_ARB_create_context_profile");

	{
		const ApiType	apiType		= contextType.getAPI();
		int				profileMask	= 0;

		switch (apiType.getProfile())
		{
			case glu::PROFILE_ES:
				checkGlxExtension(m_display, "GLX_EXT_create_context_es2_profile");
				profileMask = GLX_CONTEXT_ES2_PROFILE_BIT_EXT;
				break;
			case glu::PROFILE_CORE:
				profileMask = GLX_CONTEXT_CORE_PROFILE_BIT_ARB;
				break;
			case glu::PROFILE_COMPATIBILITY:
				profileMask = GLX_CONTEXT_COMPATIBILITY_PROFILE_BIT_ARB;
				break;
			default:
				DE_FATAL("Impossible context profile");
		}

		attribs.push_back(GLX_CONTEXT_MAJOR_VERSION_ARB);
		attribs.push_back(apiType.getMajorVersion());
		attribs.push_back(GLX_CONTEXT_MINOR_VERSION_ARB);
		attribs.push_back(apiType.getMinorVersion());
		attribs.push_back(GLX_CONTEXT_PROFILE_MASK_ARB);
		attribs.push_back(profileMask);
	}

	// Context flags
	{
		int		flags	= 0;

		if ((contextType.getFlags() & glu::CONTEXT_FORWARD_COMPATIBLE) != 0)
		{
			if (glu::isContextTypeES(contextType))
				TCU_THROW(InternalError, "Only OpenGL core contexts can be forward-compatible");

			flags |= GLX_CONTEXT_FORWARD_COMPATIBLE_BIT_ARB;
		}

		if ((contextType.getFlags() & glu::CONTEXT_DEBUG) != 0)
			flags |= GLX_CONTEXT_DEBUG_BIT_ARB;

		if ((contextType.getFlags() & glu::CONTEXT_ROBUST) != 0)
			flags |= GLX_CONTEXT_ROBUST_ACCESS_BIT_ARB;

		if (flags != 0)
		{
			attribs.push_back(GLX_CONTEXT_FLAGS_ARB);
			attribs.push_back(flags);
		}
	}

	if (resetNotificationStrategy != glu::RESET_NOTIFICATION_STRATEGY_NOT_SPECIFIED)
	{
		if (glu::isContextTypeES(contextType))
			TCU_THROW(InternalError, "Specifying reset notification strategy is not allowed when creating OpenGL ES contexts");

		attribs.push_back(GLX_CONTEXT_RESET_NOTIFICATION_STRATEGY_ARB);

		if (resetNotificationStrategy == glu::RESET_NOTIFICATION_STRATEGY_NO_RESET_NOTIFICATION)
			attribs.push_back(GLX_NO_RESET_NOTIFICATION_ARB);
		else if (resetNotificationStrategy == glu::RESET_NOTIFICATION_STRATEGY_LOSE_CONTEXT_ON_RESET)
			attribs.push_back(GLX_LOSE_CONTEXT_ON_RESET_ARB);
		else
			TCU_THROW(InternalError, "Unknown reset notification strategy");
	}

	// Terminate attrib list
	attribs.push_back(None);

	return TCU_CHECK_GLX(factory.m_glXCreateContextAttribsARB(
							 getXDisplay(), m_fbConfig, DE_NULL, True, &attribs[0]));
}